

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O3

uchar * rans_compress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  ulong uVar16;
  char cVar17;
  uint uVar18;
  ulong uVar19;
  uchar *puVar20;
  uint uVar21;
  ulong uVar22;
  uchar *puVar23;
  size_t __n;
  uchar *puVar24;
  short sVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  byte *pbVar32;
  byte *pbVar33;
  double dVar34;
  double dVar35;
  int F [256];
  RansEncSymbol syms [256];
  uint local_1438 [256];
  uint local_1038 [3];
  ushort local_102c;
  byte local_102a [4090];
  
  uVar28 = (ulong)in_size;
  dVar35 = (double)uVar28;
  dVar34 = dVar35 * 1.05 + 198147.0 + 9.0;
  uVar19 = (ulong)dVar34;
  puVar20 = (uchar *)malloc((long)(dVar34 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19);
  memset(local_1438,0,0x400);
  if (puVar20 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  uVar19 = 0;
  if (in_size == 0) {
    uVar28 = 0;
  }
  else {
    uVar22 = 0;
    do {
      local_1438[in[uVar22]] = local_1438[in[uVar22]] + 1;
      uVar22 = uVar22 + 1;
    } while (uVar28 != uVar22);
  }
  puVar24 = puVar20 + (long)(int)(dVar35 * 1.05) + 0x3060c;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar28;
  uVar28 = 0;
  uVar21 = 0;
  iVar30 = 0;
  do {
    uVar18 = local_1438[uVar28];
    if ((long)(int)uVar18 != 0) {
      uVar26 = uVar21;
      if ((int)uVar21 <= (int)uVar18) {
        uVar26 = uVar18;
      }
      if ((int)uVar21 < (int)uVar18) {
        uVar19 = uVar28 & 0xffffffff;
      }
      uVar21 = (uint)((long)(int)uVar18 *
                      (0x40000000 / (ulong)in_size +
                      SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000000)) / auVar15,0)) >> 0x1f);
      if (uVar21 < 2) {
        uVar21 = 1;
      }
      local_1438[uVar28] = uVar21;
      iVar30 = uVar21 + iVar30;
      uVar21 = uVar26;
    }
    uVar28 = uVar28 + 1;
  } while (uVar28 != 0x100);
  uVar21 = (local_1438[(int)uVar19] - iVar30) + 0xfff;
  local_1438[(int)uVar19] = uVar21;
  if ((int)uVar21 < 1) {
    __assert_fail("F[M]>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x6d,
                  "unsigned char *rans_compress_O0(unsigned char *, unsigned int, unsigned int *)");
  }
  pbVar32 = puVar20 + 9;
  lVar29 = 0;
  uVar19 = 1;
  iVar30 = 0;
  uVar21 = 0;
  do {
    if (local_1438[lVar29] != 0) {
      if (iVar30 == 0) {
        *pbVar32 = (byte)lVar29;
        pbVar33 = pbVar32 + 1;
        iVar30 = 0;
        if ((lVar29 != 0) && (iVar30 = 0, local_1438[lVar29 + -1] != 0)) {
          uVar18 = (int)lVar29 + 1;
          uVar22 = (ulong)uVar18;
          uVar28 = uVar19;
          if (lVar29 != 0xff) {
            do {
              uVar22 = uVar28;
              if (local_1438[uVar22] == 0) goto LAB_00135779;
              uVar28 = uVar22 + 1;
            } while (uVar22 + 1 != 0x100);
            uVar22 = 0x100;
          }
LAB_00135779:
          iVar30 = (int)uVar22 - uVar18;
          pbVar32[1] = (byte)iVar30;
          pbVar33 = pbVar32 + 2;
        }
      }
      else {
        iVar30 = iVar30 + -1;
        pbVar33 = pbVar32;
      }
      uVar18 = local_1438[lVar29];
      lVar31 = 1;
      pbVar32 = pbVar33;
      if (0x7f < (int)uVar18) {
        *pbVar33 = (byte)(uVar18 >> 8) | 0x80;
        uVar18 = local_1438[lVar29];
        lVar31 = 2;
        pbVar32 = pbVar33 + 1;
      }
      *pbVar32 = (byte)uVar18;
      if (0x1000 < uVar21) {
        __assert_fail("start <= (1u << scale_bits)",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                      ,0xba,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)")
        ;
      }
      uVar18 = local_1438[lVar29];
      if (0x1000 - uVar21 < uVar18) {
        __assert_fail("freq <= (1u << scale_bits) - start",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                      ,0xbb,"void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)")
        ;
      }
      local_1038[lVar29 * 4] = uVar18 << 0x13;
      *(short *)(local_102a + lVar29 * 0x10 + -2) = 0x1000 - (short)uVar18;
      if (uVar18 < 2) {
        local_1038[lVar29 * 4 + 1] = 0xffffffff;
        local_1038[lVar29 * 4 + 2] = uVar21 + 0xfff;
        sVar25 = 0x20;
      }
      else {
        sVar25 = 0x1e;
        do {
          cVar17 = (char)sVar25;
          sVar25 = sVar25 + 1;
        } while ((uint)(1 << (cVar17 - 0x1eU & 0x1f)) < uVar18);
        local_1038[lVar29 * 4 + 1] =
             (uint)((((1L << ((byte)sVar25 & 0x3f)) + (ulong)uVar18) - 1) / (ulong)uVar18);
        local_1038[lVar29 * 4 + 2] = uVar21;
      }
      pbVar32 = pbVar33 + lVar31;
      *(short *)(local_102a + lVar29 * 0x10) = sVar25;
      uVar21 = uVar18 + uVar21;
    }
    lVar29 = lVar29 + 1;
    uVar19 = uVar19 + 1;
  } while (lVar29 != 0x100);
  *pbVar32 = 0;
  uVar21 = 0x800000;
  uVar18 = 0x800000;
  puVar23 = puVar24;
  switch(in_size & 3) {
  case 0:
    uVar26 = 0x800000;
    goto LAB_001358ef;
  case 1:
    goto switchD_001357b5_caseD_1;
  case 3:
    uVar19 = (ulong)in[in_size - 1];
    uVar21 = local_1038[uVar19 * 4];
    if (uVar21 == 0) goto LAB_00135b51;
    uVar18 = 0x800000;
    if (uVar21 < 0x800001) {
      do {
        puVar23[-1] = (uchar)uVar18;
        puVar23 = puVar23 + -1;
        uVar18 = uVar18 >> 8;
      } while (uVar21 <= uVar18);
    }
    uVar21 = (uint)*(ushort *)(local_102a + uVar19 * 0x10 + -2) *
             (int)((ulong)local_1038[uVar19 * 4 + 1] * (ulong)uVar18 >>
                  (local_102a[uVar19 * 0x10] & 0x3f)) + uVar18 + local_1038[uVar19 * 4 + 2];
  }
  uVar19 = (ulong)in[(in_size - (in_size & 3)) + 1];
  uVar18 = local_1038[uVar19 * 4];
  if (uVar18 != 0) {
    uVar26 = 0x800000;
    if (uVar18 < 0x800001) {
      do {
        puVar23[-1] = (uchar)uVar26;
        puVar23 = puVar23 + -1;
        uVar26 = uVar26 >> 8;
      } while (uVar18 <= uVar26);
    }
    uVar18 = (uint)*(ushort *)(local_102a + uVar19 * 0x10 + -2) *
             (int)((ulong)local_1038[uVar19 * 4 + 1] * (ulong)uVar26 >>
                  (local_102a[uVar19 * 0x10] & 0x3f)) + uVar26 + local_1038[uVar19 * 4 + 2];
switchD_001357b5_caseD_1:
    uVar19 = (ulong)in[in_size & 0xfffffffc];
    uVar26 = local_1038[uVar19 * 4];
    if (uVar26 != 0) {
      uVar27 = 0x800000;
      if (uVar26 < 0x800001) {
        do {
          puVar23[-1] = (uchar)uVar27;
          puVar23 = puVar23 + -1;
          uVar27 = uVar27 >> 8;
        } while (uVar26 <= uVar27);
      }
      uVar26 = (uint)*(ushort *)(local_102a + uVar19 * 0x10 + -2) *
               (int)((ulong)local_1038[uVar19 * 4 + 1] * (ulong)uVar27 >>
                    (local_102a[uVar19 * 0x10] & 0x3f)) + uVar27 + local_1038[uVar19 * 4 + 2];
LAB_001358ef:
      if ((int)(in_size & 0xfffffffc) < 1) {
        uVar27 = 0x800000;
      }
      else {
        uVar27 = 0x800000;
        uVar19 = (ulong)(in_size & 0xfffffffc);
        do {
          uVar28 = (ulong)in[uVar19 - 1];
          uVar8 = local_1038[uVar28 * 4];
          if (uVar8 == 0) goto LAB_00135b51;
          bVar1 = in[uVar19 - 2];
          bVar2 = in[uVar19 - 3];
          bVar3 = in[uVar19 - 4];
          for (; uVar8 <= uVar27; uVar27 = uVar27 >> 8) {
            puVar23[-1] = (uchar)uVar27;
            puVar23 = puVar23 + -1;
          }
          uVar8 = local_1038[uVar28 * 4 + 1];
          bVar4 = local_102a[uVar28 * 0x10];
          uVar22 = (ulong)bVar1;
          uVar9 = local_1038[uVar22 * 4];
          if (uVar9 == 0) goto LAB_00135b51;
          uVar10 = local_1038[uVar28 * 4 + 2];
          uVar5 = *(ushort *)(local_102a + uVar28 * 0x10 + -2);
          uVar28 = (ulong)uVar21;
          while (uVar9 <= uVar21) {
            puVar23[-1] = (uchar)uVar28;
            puVar23 = puVar23 + -1;
            uVar21 = (uint)(uVar28 >> 8);
            uVar28 = uVar28 >> 8;
          }
          uVar21 = local_1038[uVar22 * 4 + 1];
          bVar1 = local_102a[uVar22 * 0x10];
          uVar16 = (ulong)bVar2;
          uVar9 = local_1038[uVar16 * 4];
          if (uVar9 == 0) goto LAB_00135b51;
          uVar11 = local_1038[uVar22 * 4 + 2];
          uVar6 = *(ushort *)(local_102a + uVar22 * 0x10 + -2);
          for (; uVar9 <= uVar18; uVar18 = uVar18 >> 8) {
            puVar23[-1] = (uchar)uVar18;
            puVar23 = puVar23 + -1;
          }
          uVar9 = local_1038[uVar16 * 4 + 1];
          bVar2 = local_102a[uVar16 * 0x10];
          uVar22 = (ulong)bVar3;
          uVar12 = local_1038[uVar22 * 4];
          if (uVar12 == 0) goto LAB_00135b51;
          uVar13 = local_1038[uVar16 * 4 + 2];
          uVar7 = *(ushort *)(local_102a + uVar16 * 0x10 + -2);
          for (; uVar12 <= uVar26; uVar26 = uVar26 >> 8) {
            puVar23[-1] = (uchar)uVar26;
            puVar23 = puVar23 + -1;
          }
          uVar27 = uVar27 + uVar10 +
                   (int)((ulong)uVar8 * (ulong)uVar27 >> (bVar4 & 0x3f)) * (uint)uVar5;
          uVar21 = (int)uVar28 + uVar11 + (int)(uVar21 * uVar28 >> (bVar1 & 0x3f)) * (uint)uVar6;
          uVar18 = uVar18 + uVar13 +
                   (int)((ulong)uVar9 * (ulong)uVar18 >> (bVar2 & 0x3f)) * (uint)uVar7;
          uVar26 = uVar26 + local_1038[uVar22 * 4 + 2] +
                   (uint)*(ushort *)(local_102a + uVar22 * 0x10 + -2) *
                   (int)((ulong)local_1038[uVar22 * 4 + 1] * (ulong)uVar26 >>
                        (local_102a[uVar22 * 0x10] & 0x3f));
          bVar14 = 4 < (long)uVar19;
          uVar19 = uVar19 - 4;
        } while (bVar14);
      }
      *(uint *)(puVar23 + -4) = uVar27;
      puVar23[-8] = (uchar)uVar21;
      puVar23[-7] = (uchar)(uVar21 >> 8);
      puVar23[-6] = (uchar)(uVar21 >> 0x10);
      puVar23[-5] = (uchar)(uVar21 >> 0x18);
      puVar23[-0xc] = (uchar)uVar18;
      puVar23[-0xb] = (uchar)(uVar18 >> 8);
      puVar23[-10] = (uchar)(uVar18 >> 0x10);
      puVar23[-9] = (uchar)(uVar18 >> 0x18);
      pbVar32 = pbVar32 + (1 - (long)puVar20);
      puVar23[-0x10] = (uchar)uVar26;
      puVar23[-0xf] = (uchar)(uVar26 >> 8);
      puVar23[-0xe] = (uchar)(uVar26 >> 0x10);
      puVar23[-0xd] = (uchar)(uVar26 >> 0x18);
      __n = (long)puVar24 - (long)(puVar23 + -0x10);
      uVar21 = (uint)(pbVar32 + __n);
      *out_size = uVar21;
      *puVar20 = '\0';
      puVar20[1] = (char)(pbVar32 + __n) + 0xf7;
      puVar20[2] = (uchar)(uVar21 + 0xfff7 >> 8);
      puVar20[3] = (uchar)(uVar21 + 0xfffff7 >> 0x10);
      puVar20[4] = (uchar)(uVar21 - 9 >> 0x18);
      puVar20[5] = (uchar)in_size;
      puVar20[6] = (uchar)(in_size >> 8);
      puVar20[7] = (uchar)(in_size >> 0x10);
      puVar20[8] = (uchar)(in_size >> 0x18);
      memmove(puVar20 + (int)pbVar32,puVar23 + -0x10,__n);
      return puVar20;
    }
  }
LAB_00135b51:
  __assert_fail("sym->x_max != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0x10f,"void RansEncPutSymbol(RansState *, uint8_t **, const RansEncSymbol *)");
}

Assistant:

unsigned char *rans_compress_O0(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    unsigned char *cp, *out_end;
    RansEncSymbol syms[256];
    RansState rans0, rans1, rans2, rans3;
    uint8_t* ptr;
    int F[256] = {0}, i, j, tab_size, rle, x, fsum = 0;
    int m = 0, M = 0;
    uint64_t tr;

    if (!out_buf)
	return NULL;

    ptr = out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;

    // Compute statistics
    for (i = 0; i < in_size; i++) {
	F[in[i]]++;
    }
    tr = ((uint64_t)TOTFREQ<<31)/in_size + (1<<30)/in_size;

    // Normalise so T[i] == TOTFREQ
    for (m = M = j = 0; j < 256; j++) {
	if (!F[j])
	    continue;

	if (m < F[j])
	    m = F[j], M = j;

	if ((F[j] = (F[j]*tr)>>31) == 0)
	    F[j] = 1;
	fsum += F[j];
    }

    fsum++;
    if (fsum < TOTFREQ)
	F[M] += TOTFREQ-fsum;
    else
	F[M] -= fsum-TOTFREQ;

    //printf("F[%d]=%d\n", M, F[M]);
    assert(F[M]>0);

    // Encode statistics.
    cp = out_buf+9;

    for (x = rle = j = 0; j < 256; j++) {
	if (F[j]) {
	    // j
	    if (rle) {
		rle--;
	    } else {
		*cp++ = j;
		if (!rle && j && F[j-1])  {
		    for(rle=j+1; rle<256 && F[rle]; rle++)
			;
		    rle -= j+1;
		    *cp++ = rle;
		}
		//fprintf(stderr, "%d: %d %d\n", j, rle, N[j]);
	    }

	    // F[j]
	    if (F[j]<128) {
		*cp++ = F[j];
	    } else {
		*cp++ = 128 | (F[j]>>8);
		*cp++ = F[j]&0xff;
	    }
	    RansEncSymbolInit(&syms[j], x, F[j], TF_SHIFT);
	    x += F[j];
	}
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp-out_buf;

    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    switch (i=(in_size&3)) {
    case 3: RansEncPutSymbol(&rans2, &ptr, &syms[in[in_size-(i-2)]]);
    case 2: RansEncPutSymbol(&rans1, &ptr, &syms[in[in_size-(i-1)]]);
    case 1: RansEncPutSymbol(&rans0, &ptr, &syms[in[in_size-(i-0)]]);
    case 0:
	break;
    }
    for (i=(in_size &~3); i>0; i-=4) {
	RansEncSymbol *s3 = &syms[in[i-1]];
	RansEncSymbol *s2 = &syms[in[i-2]];
	RansEncSymbol *s1 = &syms[in[i-3]];
	RansEncSymbol *s0 = &syms[in[i-4]];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);
    }

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    // Finalise block size and return it
    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;

    *cp++ = 0; // order
    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}